

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O1

void __thiscall IRT::CEseqFloatVisitor::Visit(CEseqFloatVisitor *this,CMemExpression *expression)

{
  CExpression *pCVar1;
  CEseqExpression *this_00;
  CEseqExpression *this_01;
  CStatement *pCVar2;
  CMemExpression *pCVar3;
  pointer *__ptr;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_58;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_50;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_48;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_40;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_38;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_30;
  
  pCVar1 = CMemExpression::getAddress(expression);
  (**(pCVar1->super_IExpression).super_INode._vptr_INode)(pCVar1,this);
  pCVar1 = (this->childExpression)._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  if (pCVar1 == (CExpression *)0x0) {
    this_00 = (CEseqExpression *)0x0;
  }
  else {
    this_00 = (CEseqExpression *)
              __dynamic_cast(pCVar1,&CExpression::typeinfo,&CEseqExpression::typeinfo,0);
  }
  if (this_00 == (CEseqExpression *)0x0) {
    pCVar3 = (CMemExpression *)operator_new(0x10);
    local_30._M_head_impl =
         (this->childExpression)._M_t.
         super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
         .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
    (this->childExpression)._M_t.
    super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t
    .super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
    super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
    CMemExpression::CMemExpression
              (pCVar3,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_30);
    pCVar1 = (this->childExpression)._M_t.
             super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
             .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
    (this->childExpression)._M_t.
    super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t
    .super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
    super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)pCVar3;
    if (pCVar1 != (CExpression *)0x0) {
      (**(code **)((long)(pCVar1->super_IExpression).super_INode + 0x10))();
    }
    if (local_30._M_head_impl != (CExpression *)0x0) {
      (*((local_30._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
  }
  else {
    this_01 = (CEseqExpression *)operator_new(0x18);
    pCVar2 = CEseqExpression::getStatement(this_00);
    (*(pCVar2->super_IStatement).super_INode._vptr_INode[3])(&local_50,pCVar2);
    local_48._M_head_impl = local_50._M_head_impl;
    local_50._M_head_impl = (CStatement *)0x0;
    pCVar3 = (CMemExpression *)operator_new(0x10);
    pCVar1 = CEseqExpression::getExpression(this_00);
    (*(pCVar1->super_IExpression).super_INode._vptr_INode[3])(&local_58,pCVar1);
    local_40._M_head_impl = local_58._M_head_impl;
    local_58._M_head_impl = (CExpression *)0x0;
    CMemExpression::CMemExpression
              (pCVar3,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_40);
    local_38._M_head_impl = (CExpression *)pCVar3;
    CEseqExpression::CEseqExpression
              (this_01,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                        *)&local_48,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_38);
    pCVar1 = (this->childExpression)._M_t.
             super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
             .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
    (this->childExpression)._M_t.
    super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t
    .super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
    super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)this_01;
    if (pCVar1 != (CExpression *)0x0) {
      (**(code **)((long)(pCVar1->super_IExpression).super_INode + 0x10))();
    }
    if ((CMemExpression *)local_38._M_head_impl != (CMemExpression *)0x0) {
      (*(((CExpression *)&(local_38._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_38._M_head_impl = (CExpression *)0x0;
    if (local_40._M_head_impl != (CExpression *)0x0) {
      (*((local_40._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_40._M_head_impl = (CExpression *)0x0;
    if (local_58._M_head_impl != (CExpression *)0x0) {
      (*((local_58._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    if (local_48._M_head_impl != (CStatement *)0x0) {
      (*((local_48._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    local_48._M_head_impl = (CStatement *)0x0;
    if (local_50._M_head_impl != (CStatement *)0x0) {
      (*((local_50._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
  }
  return;
}

Assistant:

void IRT::CEseqFloatVisitor::Visit(const IRT::CMemExpression &expression) {
    expression.getAddress()->Accept(*this);

    const CEseqExpression* eseq = CAST_TO_ESEQ(childExpression.get());
    if (eseq == nullptr) {
        childExpression = EMOVE_UNIQ(new CMemExpression(
                std::move(childExpression)
        ));
    } else {
        childExpression = EMOVE_UNIQ(new CEseqExpression(
                std::move(eseq->getStatement()->Copy()),
                EMOVE_UNIQ(new CMemExpression(
                        std::move(eseq->getExpression()->Copy())
                ))
        ));
    }
}